

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

CategoricalDistributionLayerParams * __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::New
          (CategoricalDistributionLayerParams *this,Arena *arena)

{
  CategoricalDistributionLayerParams *this_00;
  
  this_00 = (CategoricalDistributionLayerParams *)operator_new(0x30);
  CategoricalDistributionLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CategoricalDistributionLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

CategoricalDistributionLayerParams* CategoricalDistributionLayerParams::New(::google::protobuf::Arena* arena) const {
  CategoricalDistributionLayerParams* n = new CategoricalDistributionLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}